

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

lyd_node *
lyd_parse_json(ly_ctx *ctx,char *data,int options,lyd_node *rpc_act,lyd_node *data_tree,
              char *yang_data_name)

{
  lyd_node *target;
  uint uVar1;
  int iVar2;
  lyd_node *source;
  char *pcVar3;
  bool bVar4;
  lyd_node *local_c0;
  lyd_node *local_a8;
  attr_cont *local_a0;
  attr_cont *attrs;
  uint local_90;
  int act_cont;
  uint r;
  uint len;
  unres_data *unres;
  lyd_node *act_notif;
  lyd_node *reply_top;
  lyd_node *reply_parent;
  lyd_node *iter;
  lyd_node *next;
  lyd_node *result;
  char *yang_data_name_local;
  lyd_node *data_tree_local;
  lyd_node *rpc_act_local;
  char *pcStack_30;
  int options_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  next = (lyd_node *)0x0;
  reply_top = (lyd_node *)0x0;
  act_notif = (lyd_node *)0x0;
  unres = (unres_data *)0x0;
  _r = (unres_data *)0x0;
  act_cont = 0;
  attrs._4_4_ = 0;
  local_a0 = (attr_cont *)0x0;
  result = (lyd_node *)yang_data_name;
  yang_data_name_local = (char *)data_tree;
  data_tree_local = rpc_act;
  rpc_act_local._4_4_ = options;
  pcStack_30 = data;
  data_local = (char *)ctx;
  if ((ctx == (ly_ctx *)0x0) || (data == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_parse_json");
    return (lyd_node *)0x0;
  }
  uVar1 = skip_ws(data);
  act_cont = uVar1 + act_cont;
  if (pcStack_30[(uint)act_cont] != '{') {
    ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
            "JSON data (missing top level begin-object)");
    return (lyd_node *)0x0;
  }
  local_90 = act_cont + 1;
  uVar1 = skip_ws(pcStack_30 + local_90);
  local_90 = uVar1 + local_90;
  if (pcStack_30[local_90] == '}') {
    if ((rpc_act_local._4_4_ & 0x20000) != 0) {
      next = ly_ctx_info((ly_ctx *)data_local);
    }
    lyd_validate(&next,rpc_act_local._4_4_,data_local);
    return next;
  }
  _r = (unres_data *)calloc(1,0x28);
  if (_r == (unres_data *)0x0) {
    ly_log((ly_ctx *)data_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_parse_json"
          );
    return (lyd_node *)0x0;
  }
  if (data_tree_local != (lyd_node *)0x0) {
    if ((rpc_act_local._4_4_ & 0x20) == 0) {
      __assert_fail("options & LYD_OPT_RPCREPLY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_json.c"
                    ,0x541,
                    "struct lyd_node *lyd_parse_json(struct ly_ctx *, const char *, int, const struct lyd_node *, const struct lyd_node *, const char *)"
                   );
    }
    if (data_tree_local->schema->nodetype == LYS_RPC) {
      act_notif = _lyd_new((lyd_node *)0x0,data_tree_local->schema,0);
      reply_top = act_notif;
    }
    else {
      act_notif = lyd_dup(data_tree_local,1);
      reply_parent = act_notif;
      while ((reply_top = reply_parent, reply_parent != (lyd_node *)0x0 &&
             (reply_parent->schema->nodetype != LYS_ACTION))) {
        if ((reply_parent->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          reply_parent = reply_parent->child;
        }
        else {
          reply_parent = (lyd_node *)0x0;
        }
        if (reply_parent == (lyd_node *)0x0) {
          if (reply_top == act_notif) break;
          reply_parent = reply_top->next;
        }
        while ((reply_parent == (lyd_node *)0x0 &&
               (reply_top = reply_top->parent, reply_top->parent != act_notif->parent))) {
          reply_parent = reply_top->next;
        }
      }
      if (reply_top == (lyd_node *)0x0) {
        ly_log((ly_ctx *)data_local,LY_LLERR,LY_EINVAL,
               "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_json");
        goto LAB_0015ec26;
      }
      lyd_free_withsiblings(reply_top->child);
    }
  }
  reply_parent = (lyd_node *)0x0;
  iter = reply_top;
  do {
    act_cont = act_cont + 1;
    uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
    act_cont = uVar1 + act_cont;
    if (attrs._4_4_ == 0) {
      iVar2 = strncmp(pcStack_30 + (uint)act_cont,"\"yang:action\"",0xd);
      if (iVar2 == 0) {
        act_cont = act_cont + 0xd;
        uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
        act_cont = uVar1 + act_cont;
        if (pcStack_30[(uint)act_cont] != ':') {
          ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
                  "JSON data (missing top-level begin-object)");
          goto LAB_0015ec26;
        }
        act_cont = act_cont + 1;
        uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
        act_cont = uVar1 + act_cont;
        if (pcStack_30[(uint)act_cont] != '{') {
          ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
                  "JSON data (missing top level yang:action object)");
          goto LAB_0015ec26;
        }
        act_cont = act_cont + 1;
        uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
        act_cont = uVar1 + act_cont;
        attrs._4_4_ = 1;
      }
      else {
        attrs._4_4_ = -1;
      }
    }
    local_90 = json_parse_data((ly_ctx *)data_local,pcStack_30 + (uint)act_cont,(lys_node *)0x0,
                               &iter,next,reply_parent,&local_a0,rpc_act_local._4_4_,_r,
                               (lyd_node **)&unres,(char *)result);
    if (local_90 == 0) goto LAB_0015ec26;
    act_cont = local_90 + act_cont;
    if (next == (lyd_node *)0x0) {
      if (reply_top == (lyd_node *)0x0) {
        reply_parent = iter;
        while( true ) {
          bVar4 = false;
          if (reply_parent != (lyd_node *)0x0) {
            bVar4 = reply_parent->prev->next != (lyd_node *)0x0;
          }
          if (!bVar4) break;
          reply_parent = reply_parent->prev;
        }
        next = reply_parent;
        if (((reply_parent != (lyd_node *)0x0) && ((rpc_act_local._4_4_ & 0x20000) != 0)) &&
           (reply_parent->schema->module ==
            *(lys_module **)
             (*(long *)(data_local + 0x40) + (long)(int)((byte)data_local[0x84] - 1) * 8))) {
          rpc_act_local._4_4_ = rpc_act_local._4_4_ & 0xfffdffff;
        }
        reply_parent = iter;
      }
      else {
        next = iter->child;
        if (iter->child == (lyd_node *)0x0) {
          local_a8 = (lyd_node *)0x0;
        }
        else {
          local_a8 = iter->child->prev;
        }
        reply_parent = local_a8;
      }
    }
    else {
      reply_parent = next->prev;
    }
    if (reply_top == (lyd_node *)0x0) {
      iter = (lyd_node *)0x0;
    }
  } while (pcStack_30[(uint)act_cont] == ',');
  if (pcStack_30[(uint)act_cont] == '}') {
    act_cont = act_cont + 1;
    uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
    act_cont = uVar1 + act_cont;
    if (attrs._4_4_ == 1) {
      if (pcStack_30[(uint)act_cont] != '}') {
        ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
                "JSON data (missing top-level end-object)");
        goto LAB_0015ec26;
      }
      act_cont = act_cont + 1;
      uVar1 = skip_ws(pcStack_30 + (uint)act_cont);
      act_cont = uVar1 + act_cont;
    }
    iVar2 = store_attrs((ly_ctx *)data_local,local_a0,next,rpc_act_local._4_4_);
    if (iVar2 == 0) {
      if (act_notif != (lyd_node *)0x0) {
        next = act_notif;
      }
      if (next == (lyd_node *)0x0) {
        ly_log((ly_ctx *)data_local,LY_LLERR,LY_EVALID,
               "Model for the data to be linked with not found.");
      }
      else if (((rpc_act_local._4_4_ & 0x30) == 0) || (iVar2 = lyd_schema_sort(next,1), iVar2 == 0))
      {
        target = next;
        if (((rpc_act_local._4_4_ & 0x20) == 0) || (data_tree_local->schema->nodetype == LYS_RPC)) {
          if (((rpc_act_local._4_4_ & 0x50) != 0) && (unres == (unres_data *)0x0)) {
            pcVar3 = "notification";
            if ((rpc_act_local._4_4_ & 0x10) != 0) {
              pcVar3 = "action";
            }
            ly_vlog((ly_ctx *)data_local,LYE_MISSELEM,LY_VLOG_LYD,next,pcVar3,next->schema->name);
            goto LAB_0015ec26;
          }
        }
        else {
          unres = (unres_data *)reply_top;
        }
        if ((rpc_act_local._4_4_ & 0x20000) != 0) {
          source = ly_ctx_info((ly_ctx *)data_local);
          iVar2 = lyd_merge(target,source,0x500);
          if (iVar2 != 0) {
            ly_log((ly_ctx *)data_local,LY_LLERR,LY_EINT,"Adding ietf-yang-library data failed.");
            goto LAB_0015ec26;
          }
        }
        for (reply_parent = next; reply_parent != (lyd_node *)0x0; reply_parent = reply_parent->next
            ) {
          if ((((reply_parent->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
              ((reply_parent->validity & 1) != 0)) &&
             (iVar2 = lyv_data_dup(reply_parent,next), iVar2 != 0)) goto LAB_0015ec26;
        }
        iVar2 = lyd_defaults_add_unres
                          (&next,rpc_act_local._4_4_,(ly_ctx *)data_local,(lys_module **)0x0,0,
                           (lyd_node *)yang_data_name_local,(lyd_node *)unres,_r,1);
        if (iVar2 == 0) {
          if ((rpc_act_local._4_4_ & 0x2080) == 0) {
            if (unres == (unres_data *)0x0) {
              local_c0 = next;
            }
            else {
              local_c0 = (lyd_node *)unres;
            }
            iVar2 = lyd_check_mandatory_tree
                              (local_c0,(ly_ctx *)data_local,(lys_module **)0x0,0,
                               rpc_act_local._4_4_);
            if (iVar2 != 0) goto LAB_0015ec26;
          }
          free(_r->node);
          free(_r->type);
          free(_r);
          return next;
        }
      }
    }
  }
  else {
    ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
            "JSON data (missing top-level end-object)");
  }
LAB_0015ec26:
  lyd_free_withsiblings(next);
  if ((act_notif != (lyd_node *)0x0) && (next != act_notif)) {
    lyd_free_withsiblings(act_notif);
  }
  free(_r->node);
  free(_r->type);
  free(_r);
  return (lyd_node *)0x0;
}

Assistant:

struct lyd_node *
lyd_parse_json(struct ly_ctx *ctx, const char *data, int options, const struct lyd_node *rpc_act,
               const struct lyd_node *data_tree, const char *yang_data_name)
{
    struct lyd_node *result = NULL, *next, *iter, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct unres_data *unres = NULL;
    unsigned int len = 0, r;
    int act_cont = 0;
    struct attr_cont *attrs = NULL;

    if (!ctx || !data) {
        LOGARG;
        return NULL;
    }

    /* skip leading whitespaces */
    len += skip_ws(&data[len]);

    /* expect top-level { */
    if (data[len] != '{') {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level begin-object)");
        return NULL;
    }

    /* check for empty object */
    r = len + 1;
    r += skip_ws(&data[r]);
    if (data[r] == '}') {
        if (options & LYD_OPT_DATA_ADD_YANGLIB) {
            result = ly_ctx_info(ctx);
        }
        lyd_validate(&result, options, ctx);
        return result;
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    /* create RPC/action reply part that is not in the parsed data */
    if (rpc_act) {
        assert(options & LYD_OPT_RPCREPLY);
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }

    iter = NULL;
    next = reply_parent;
    do {
        len++;
        len += skip_ws(&data[len]);

        if (!act_cont) {
            if (!strncmp(&data[len], "\"yang:action\"", 13)) {
                len += 13;
                len += skip_ws(&data[len]);
                if (data[len] != ':') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level begin-object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);
                if (data[len] != '{') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level yang:action object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);

                act_cont = 1;
            } else {
                act_cont = -1;
            }
        }

        r = json_parse_data(ctx, &data[len], NULL, &next, result, iter, &attrs, options, unres, &act_notif, yang_data_name);
        if (!r) {
            goto error;
        }
        len += r;

        if (!result) {
            if (reply_parent) {
                result = next->child;
                iter = next->child ? next->child->prev : NULL;
            } else {
                for (iter = next; iter && iter->prev->next; iter = iter->prev);
                result = iter;
                if (iter && (options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                    /* ietf-yang-library data present, so ignore the option to add them */
                    options &= ~LYD_OPT_DATA_ADD_YANGLIB;
                }
                iter = next;
            }
        } else {
            iter = result->prev;
        }
        if (!reply_parent) {
            next = NULL;
        }
    } while (data[len] == ',');

    if (data[len] != '}') {
        /* expecting end-object */
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
        goto error;
    }
    len++;
    len += skip_ws(&data[len]);

    if (act_cont == 1) {
        if (data[len] != '}') {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
            goto error;
        }
        len++;
        len += skip_ws(&data[len]);
    }

    /* store attributes */
    if (store_attrs(ctx, attrs, result, options)) {
        goto error;
    }

    if (reply_top) {
        result = reply_top;
    }

    if (!result) {
        LOGERR(ctx, LY_EVALID, "Model for the data to be linked with not found.");
        goto error;
    }

    /* order the elements by hand as it is not required of the JSON input */
    if ((options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY))) {
        if (lyd_schema_sort(result, 1)) {
            goto error;
        }
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, result, (options & LYD_OPT_RPC ? "action" : "notification"), result->schema->name);
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniquness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add/validate default values, unres */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }

    /* check for missing top level mandatory nodes */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    free(unres->node);
    free(unres->type);
    free(unres);

    return result;

error:
    lyd_free_withsiblings(result);
    if (reply_top && result != reply_top) {
        lyd_free_withsiblings(reply_top);
    }
    free(unres->node);
    free(unres->type);
    free(unres);

    return NULL;
}